

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::base::TypedConfigurations::unsafeValidateFileRolling
          (TypedConfigurations *this,Level level,PreRollOutCallback *preRollOutCallback)

{
  __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  element_type *fs_00;
  unsigned_long uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *__args;
  string local_60 [8];
  string fname;
  size_t currFileSize;
  size_t maxLogFileSize;
  fstream_t *fs;
  PreRollOutCallback *preRollOutCallback_local;
  Level level_local;
  TypedConfigurations *this_local;
  
  this_00 = &unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                       (this,level,&this->m_fileStreamMap,"fileStream")->
             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  fs_00 = utils::std::
          __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ::get(this_00);
  if (fs_00 == (element_type *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    uVar1 = unsafeGetConfigByVal<unsigned_long>
                      (this,level,&this->m_maxLogFileSizeMap,"maxLogFileSize");
    fname.field_2._8_8_ = utils::File::getSizeOfFile(fs_00);
    if ((uVar1 == 0) || ((ulong)fname.field_2._8_8_ < uVar1)) {
      this_local._7_1_ = false;
    }
    else {
      pbVar2 = unsafeGetConfigByRef<std::__cxx11::string>
                         (this,level,&this->m_filenameMap,"filename");
      std::__cxx11::string::string(local_60,(string *)pbVar2);
      std::fstream::close();
      __args = (char *)std::__cxx11::string::c_str();
      utils::std::function<void_(const_char_*,_unsigned_long)>::operator()
                (preRollOutCallback,__args,fname.field_2._8_8_);
      utils::std::operator|(_S_out,_S_trunc);
      std::fstream::open((string *)fs_00,(_Ios_Openmode)local_60);
      this_local._7_1_ = true;
      std::__cxx11::string::~string(local_60);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TypedConfigurations::unsafeValidateFileRolling(Level level, const PreRollOutCallback& preRollOutCallback) {
  base::type::fstream_t* fs = unsafeGetConfigByRef(level, &m_fileStreamMap, "fileStream").get();
  if (fs == nullptr) {
    return true;
  }
  std::size_t maxLogFileSize = unsafeGetConfigByVal(level, &m_maxLogFileSizeMap, "maxLogFileSize");
  std::size_t currFileSize = base::utils::File::getSizeOfFile(fs);
  if (maxLogFileSize != 0 && currFileSize >= maxLogFileSize) {
    std::string fname = unsafeGetConfigByRef(level, &m_filenameMap, "filename");
    ELPP_INTERNAL_INFO(1, "Truncating log file [" << fname << "] as a result of configurations for level ["
                       << LevelHelper::convertToString(level) << "]");
    fs->close();
    preRollOutCallback(fname.c_str(), currFileSize);
    fs->open(fname, std::fstream::out | std::fstream::trunc);
    return true;
  }
  return false;
}